

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectDeclaration_Parameter.h
# Opt level: O0

void __thiscall
psy::C::ParameterDeclarationSymbol::~ParameterDeclarationSymbol(ParameterDeclarationSymbol *this)

{
  ~ParameterDeclarationSymbol
            ((ParameterDeclarationSymbol *)
             &this[-1].super_ObjectDeclarationSymbol.super_DeclarationSymbol.super_Symbol.impl_);
  return;
}

Assistant:

class PSY_C_API ParameterDeclarationSymbol final : public ObjectDeclarationSymbol
{
public:
    //!@{
    /**
     * Cast \c this Symbol as a ParameterDeclarationSymbol.
     */
    virtual ParameterDeclarationSymbol* asParameterDeclaration() override { return this; }
    virtual const ParameterDeclarationSymbol* asParameterDeclaration() const override { return this; }
    //!@}

PSY_INTERNAL:
    PSY_GRANT_INTERNAL_ACCESS(DeclarationBinder);

    ParameterDeclarationSymbol(const Symbol* containingSym,
              const SyntaxTree* tree,
              const Scope* enclosingScope);
}